

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O2

void list_directory_from_sftp_print(fxp_name *name)

{
  char *__s;
  
  __s = stripctrl_string(string_scc,name->longname);
  while (__s != (char *)0x0) {
    puts(__s);
    safefree(__s);
    __s = (char *)0x0;
  }
  return;
}

Assistant:

void list_directory_from_sftp_print(struct fxp_name *name)
{
    with_stripctrl(san, name->longname)
        printf("%s\n", san);
}